

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HaveInstallTreeRPATH(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  string install_rpath;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  GetInstallRPATH(this,config,&local_48);
  if (local_48._M_string_length == 0) {
    bVar1 = false;
  }
  else {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"CMAKE_SKIP_INSTALL_RPATH",&local_49);
    bVar1 = cmMakefile::IsOn(this_00,&local_28);
    bVar1 = !bVar1;
    std::__cxx11::string::~string((string *)&local_28);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HaveInstallTreeRPATH(const std::string& config) const
{
  std::string install_rpath;
  this->GetInstallRPATH(config, install_rpath);
  return !install_rpath.empty() &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
}